

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientMonitor.cpp
# Opt level: O1

void __thiscall ClientMonitor::notifyRead(ClientMonitor *this,TCPSocket *socket)

{
  int iVar1;
  mapped_type *ppCVar2;
  undefined8 uVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    ppCVar2 = std::__detail::
              _Map_base<TCPSocket,_std::pair<const_TCPSocket,_Client_*>,_std::allocator<std::pair<const_TCPSocket,_Client_*>_>,_std::__detail::_Select1st,_std::equal_to<TCPSocket>,_std::hash<TCPSocket>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<TCPSocket,_std::pair<const_TCPSocket,_Client_*>,_std::allocator<std::pair<const_TCPSocket,_Client_*>_>,_std::__detail::_Select1st,_std::equal_to<TCPSocket>,_std::hash<TCPSocket>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->socketToClientMap,socket);
    (**((*ppCVar2)->super_IONotifiable)._vptr_IONotifiable)();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar3);
}

Assistant:

void ClientMonitor::notifyRead(TCPSocket & socket) {
    std::lock_guard<std::mutex> lock(clientListAccess);
    socketToClientMap[socket]->notifyRead();
}